

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_MULUW(void)

{
  bool bVar1;
  int local_18 [2];
  int e [3];
  Z80Reg reg;
  
  e[0] = -1;
  local_18[1] = 0xffffffff;
  local_18[0] = -1;
  e[1] = GetRegister(&::lp);
  if ((e[1] == Z80_HL) && (bVar1 = comma(&::lp), bVar1)) {
    e[1] = GetRegister(&::lp);
  }
  if (e[1] == 0x10) {
    local_18[0] = 0xed;
    local_18[1] = 0xc3;
  }
  else if (e[1] == 0x40) {
    local_18[0] = 0xed;
    local_18[1] = 0xf3;
  }
  EmitBytes(local_18,true);
  return;
}

Assistant:

static void OpCode_MULUW() {
		Z80Reg reg;
		int e[3];
		e[0] = e[1] = e[2] = -1;
		if ((reg = GetRegister(lp)) == Z80_HL && comma(lp)) {
			reg = GetRegister(lp);
		}
		switch (reg) {
		case Z80_BC:
			e[0] = 0xed; e[1] = 0xc3; break;
		case Z80_SP:
			e[0] = 0xed; e[1] = 0xf3; break;
		default:
			;
		}
		EmitBytes(e, true);
	}